

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O0

void __thiscall xscript::parser::ast_node::print(ast_node *this,int indent)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  reference this_00;
  pointer this_01;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *child;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
  *__range2;
  _Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
  local_20;
  iterator it;
  int i;
  int indent_local;
  ast_node *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
  ._M_cur._4_4_ = indent;
  for (it.
       super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
       ._M_cur._0_4_ = 0;
      (int)it.
           super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
           ._M_cur <
      it.
      super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
      ._M_cur._4_4_;
      it.
      super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
      ._M_cur._0_4_ =
           (int)it.
                super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                ._M_cur + 1) {
    std::operator<<((ostream *)&std::cout," ");
  }
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<xscript::parser::type_t>,_std::equal_to<xscript::parser::type_t>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::find((unordered_map<xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<xscript::parser::type_t>,_std::equal_to<xscript::parser::type_t>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)type_names,&this->type);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<xscript::parser::type_t>,_std::equal_to<xscript::parser::type_t>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       ::end((unordered_map<xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<xscript::parser::type_t>,_std::equal_to<xscript::parser::type_t>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)type_names);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[97m");
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false,_false>
                           *)&local_20);
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,ppVar2->second);
    if (this->type == TOKEN) {
      poVar3 = std::operator<<((ostream *)&std::cout," \x1b[90m");
      __str._M_len = (this->token).literal._M_len;
      __str._M_str = (this->token).literal._M_str;
      std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__str);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[0m");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[97mUNKNOWN_AST_NODE\x1b[0m");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  __end2 = std::
           vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
           ::begin(&this->children);
  child = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *)
          std::
          vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
          ::end(&this->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_*,_std::vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_*,_std::vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>_>
              ::operator*(&__end2);
    this_01 = std::
              unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
              ::operator->(this_00);
    print(this_01,it.
                  super__Node_iterator_base<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_false>
                  ._M_cur._4_4_ + 2);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_*,_std::vector<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ast_node::print(int indent) {
    for (int i = 0 ; i < indent ; i++) {
        std::cout << " ";
    }
    auto it = type_names.find(type);
    if (it != type_names.end()) {
        std::cout << COLOR_WHITE << it->second;
        if (type == TOKEN) {
            std::cout << " " COLOR_GRAY << token.literal;
        }
        std::cout << COLOR_RESET << std::endl;
    } else {
        std::cout << COLOR_WHITE "UNKNOWN_AST_NODE" COLOR_RESET << std::endl;
    }

    for (auto & child : children) {
        child->print(indent + 2);
    }
}